

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 GenStateCompileFunc(jx9_gen_state *pGen,SyString *pName,sxi32 iFlags,jx9_vm_func **ppFunc)

{
  SyHash *pHash;
  SyToken *pSVar1;
  jx9_vm *pjVar2;
  SySet *pSVar3;
  uint uVar4;
  sxi32 sVar5;
  sxi32 sVar6;
  SySet *pSet;
  SyMemBackend *pSVar7;
  GenBlock *pGVar8;
  SyHashEntry_Pr *pSVar9;
  int iVar10;
  ulong uVar11;
  SySet *pSVar12;
  char *zFormat;
  sxu32 sVar13;
  undefined4 in_register_00000014;
  SyToken *pSVar14;
  int iVar15;
  SyToken *pSVar16;
  SyToken *pCur;
  SyToken *pSVar17;
  SyBlob sSig;
  undefined4 local_bc;
  GenBlock *local_b8;
  undefined8 uStack_b0;
  SySet local_a8;
  undefined8 uStack_80;
  SyToken *local_78;
  SyToken *pSStack_70;
  SySet *local_60;
  undefined8 *local_58;
  SyBlob local_50;
  
  local_58 = (undefined8 *)CONCAT44(in_register_00000014,iFlags);
  pSVar14 = pGen->pEnd;
  sVar13 = pGen->pIn->nLine;
  pSVar17 = pGen->pIn + 1;
  pGen->pIn = pSVar17;
  if (pSVar17 < pSVar14) {
    iVar10 = 1;
    do {
      if ((pSVar17->nType >> 9 & 1) == 0) {
        if ((pSVar17->nType >> 10 & 1) != 0) {
          if (iVar10 < 2) break;
          iVar10 = iVar10 + -1;
        }
      }
      else {
        iVar10 = iVar10 + 1;
      }
      pSVar17 = pSVar17 + 1;
    } while (pSVar17 < pSVar14);
  }
  if (pSVar17 < pSVar14) {
    pSet = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0xb0);
    if ((pSet != (SySet *)0x0) &&
       (pSVar7 = (SyMemBackend *)
                 SyMemBackendStrDup(&pGen->pVm->sAllocator,pName->zString,pName->nByte),
       pSVar7 != (SyMemBackend *)0x0)) {
      pjVar2 = pGen->pVm;
      local_78 = (SyToken *)CONCAT44(local_78._4_4_,pName->nByte);
      memset(&pSet->nUsed,0,0xa0);
      pSet->eSize = 0x40;
      pSet->pAllocator = &pjVar2->sAllocator;
      pSet->pBase = (void *)0x0;
      pSet[1].nSize = 0;
      pSet[1].eSize = 0x40;
      pSet[1].nCursor = 0;
      pSet[1].pAllocator = &pjVar2->sAllocator;
      pSet[1].pUserData = (void *)0x0;
      local_60 = (SySet *)&pSet[2].nUsed;
      *(undefined4 *)&pSet[2].pUserData = 0;
      *(undefined4 *)&pSet[3].pAllocator = 0x18;
      *(jx9_vm **)&pSet[2].nUsed = pjVar2;
      pSet[3].pBase = (void *)0x0;
      SySetAlloc(local_60,0x10);
      pSet[3].nUsed = 0;
      pSet[4].pAllocator = (SyMemBackend *)0x0;
      pSet[2].pAllocator = pSVar7;
      *(undefined4 *)&pSet[2].pBase = local_78._0_4_;
      pSVar14 = pGen->pIn;
      if (pSVar14 < pSVar17) {
        local_50.pAllocator = &pGen->pVm->sAllocator;
        local_50.pBlob = (void *)0x0;
        local_50.nByte = 0;
        local_50.mByte = 0;
        local_50.nFlags = 0;
        do {
          uStack_80 = 0;
          local_a8.nUsed = 0;
          local_a8.nSize = 0;
          local_a8.pBase = (void *)0x0;
          local_b8 = (GenBlock *)0x0;
          uStack_b0 = 0;
          local_a8.pAllocator = &pGen->pVm->sAllocator;
          local_a8.eSize = 0x18;
          local_a8.nCursor = 0;
          local_a8.pUserData = (void *)0x0;
          pSVar16 = pSVar14;
          if ((pSVar14->nType & 0xc) != 0) {
            if ((pSVar14->nType & 4) != 0) {
              if ((short)pSVar14->pUserData < 0) {
                uStack_80 = 8;
              }
              else {
                uVar4 = (uint)pSVar14->pUserData;
                if ((uVar4 >> 0x10 & 1) == 0) {
                  if ((uVar4 >> 0x12 & 1) == 0) {
                    if ((uVar4 >> 0x11 & 1) == 0) {
                      jx9GenCompileError(pGen,2,pGen->pIn->nLine,
                                         "Invalid argument type \'%z\', Automatic cast will not be performed"
                                         ,pSVar14);
                    }
                    else {
                      uStack_80 = 4;
                    }
                  }
                  else {
                    uStack_80 = 1;
                  }
                }
                else {
                  uStack_80 = 2;
                }
              }
            }
            pSVar16 = pSVar14 + 1;
          }
          if (pSVar17 <= pSVar16) {
            sVar13 = pGen->pIn->nLine;
            zFormat = "Missing argument name";
LAB_00127ab3:
            iVar10 = jx9GenCompileError(pGen,1,sVar13,zFormat);
LAB_00127ac2:
            if (iVar10 == -10) {
              return -10;
            }
            goto LAB_00127ace;
          }
          if ((((pSVar16->nType & 0x10) == 0) || (pSVar17 <= pSVar16 + 1)) ||
             ((pSVar16[1].nType & 0xc) == 0)) {
            sVar13 = pGen->pIn->nLine;
            zFormat = "Invalid argument name";
            goto LAB_00127ab3;
          }
          pGVar8 = (GenBlock *)
                   SyMemBackendStrDup(&pGen->pVm->sAllocator,pSVar16[1].sData.zString,
                                      pSVar16[1].sData.nByte);
          if (pGVar8 == (GenBlock *)0x0) goto LAB_00127aff;
          uStack_b0 = CONCAT44(uStack_b0._4_4_,pSVar16[1].sData.nByte);
          pSVar14 = pSVar16 + 2;
          local_b8 = pGVar8;
          if (pSVar14 < pSVar17) {
            if ((pSVar16[2].nType & 0x400000) == 0) {
LAB_0012797e:
              if ((pSVar17 <= pSVar14) || ((pSVar14->nType & 0x20000) != 0)) {
                pSVar14 = pSVar14 + 1;
                goto LAB_00127991;
              }
              iVar10 = jx9GenCompileError(pGen,1,pSVar14->nLine,"Unexpected token \'%z\'",pSVar14);
              goto LAB_00127ac2;
            }
            pSVar1 = pSVar16 + 3;
            if (pSVar1 < pSVar17) {
              uVar11 = 0x60;
              iVar10 = 0;
              pSVar14 = pSVar1;
              do {
                uVar4 = pSVar14->nType;
                if (((uVar4 >> 0x11 & 1) != 0) && (iVar10 < 1)) break;
                iVar15 = -(uint)((uVar4 & 0x1480) != 0);
                if ((uVar4 & 0xa40) != 0) {
                  iVar15 = 1;
                }
                iVar10 = iVar10 + iVar15;
                uVar11 = uVar11 + 0x20;
                pSVar14 = pSVar14 + 1;
              } while (pSVar14 < pSVar17);
              if (0x60 < uVar11) {
                pSVar3 = pGen->pVm->pByteContainer;
                pGen->pVm->pByteContainer = &local_a8;
                local_78 = pGen->pIn;
                pSStack_70 = pGen->pEnd;
                pGen->pIn = pSVar1;
                pGen->pEnd = pSVar14;
                sVar5 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0
                                      );
                jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar5 != -3),0,(void *)0x0,(sxu32 *)0x0);
                pSVar12 = &pGen->pVm->aByteCode;
                if (pSVar3 != (SySet *)0x0) {
                  pSVar12 = pSVar3;
                }
                pGen->pVm->pByteContainer = pSVar12;
                pGen->pIn = local_78;
                pGen->pEnd = pSStack_70;
                if (sVar5 != -10) goto LAB_0012797e;
                goto LAB_00127b1a;
              }
            }
            sVar13 = pSVar16[3].nLine;
            zFormat = "Missing argument default value";
            goto LAB_00127ab3;
          }
LAB_00127991:
          if ((int)uStack_80 != 0) {
            local_bc = 0x6e;
            switch((int)uStack_80) {
            case 1:
              local_bc = 0x73;
              break;
            case 2:
              local_bc = 0x69;
              break;
            case 3:
            case 5:
            case 6:
            case 7:
              break;
            case 4:
              local_bc = 0x66;
              break;
            case 8:
              local_bc = 0x62;
              break;
            default:
              if ((int)uStack_80 == 0x40) {
                local_bc = 0x68;
              }
            }
            SyBlobAppend(&local_50,&local_bc,1);
          }
          SySetPut(pSet,&local_b8);
        } while (pSVar14 < pSVar17);
        if (local_50.nByte != 0) {
          *(void **)&pSet[3].eSize = local_50.pBlob;
          *(sxu32 *)&pSet[3].pUserData = local_50.nByte;
        }
      }
LAB_00127ace:
      pGen->pIn = pSVar17 + 1;
      sVar5 = GenStateEnterBlock(pGen,10,pGen->pVm->pByteContainer->nUsed,pSet,&local_b8);
      if (sVar5 == 0) {
        pSVar3 = pGen->pVm->pByteContainer;
        pGen->pVm->pByteContainer = local_60;
        jx9CompileBlock(pGen);
        jx9VmEmitInstr(pGen->pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
        pSVar12 = &pGen->pVm->aByteCode;
        if (pSVar3 != (SySet *)0x0) {
          pSVar12 = pSVar3;
        }
        pGen->pVm->pByteContainer = pSVar12;
        pGVar8 = pGen->pCurrent;
        if (pGVar8 != (GenBlock *)0x0) {
          pGen->pCurrent = pGVar8->pParent;
          GenStateFreeBlock(pGVar8);
        }
        if (local_58 != (undefined8 *)0x0) {
          *local_58 = pSet;
        }
        pHash = &pGen->pVm->hFunction;
        sVar13 = *(sxu32 *)&pSet[2].pBase;
        if ((sVar13 != 0) && ((pGen->pVm->hFunction).nEntry != 0)) {
          pSVar9 = HashGetEntry(pHash,pSet[2].pAllocator,sVar13);
          if (pSVar9 != (SyHashEntry_Pr *)0x0) {
            if ((SySet *)pSVar9->pUserData == pSet) {
              return 0;
            }
            pSet[4].pBase = (SySet *)pSVar9->pUserData;
            pSVar9->pUserData = pSet;
            return 0;
          }
          sVar13 = *(sxu32 *)&pSet[2].pBase;
        }
        pSet[4].pBase = (void *)0x0;
        sVar5 = SyHashInsert(pHash,pSet[2].pAllocator,sVar13,pSet);
        return sVar5;
      }
    }
LAB_00127aff:
    jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
LAB_00127b1a:
    sVar6 = -10;
  }
  else {
    sVar5 = jx9GenCompileError(pGen,1,sVar13,"Missing \')\' after function \'%z\' signature",pName);
    sVar6 = -10;
    if (sVar5 != -10) {
      pGen->pIn = pGen->pEnd;
      sVar6 = 0;
    }
  }
  return sVar6;
}

Assistant:

static sxi32 GenStateCompileFunc(
	jx9_gen_state *pGen, /* Code generator state */
	SyString *pName,     /* Function name. NULL otherwise */
	sxi32 iFlags,        /* Control flags */
	jx9_vm_func **ppFunc /* OUT: function state */
	)
{
	jx9_vm_func *pFunc;
	SyToken *pEnd;
	sxu32 nLine;
	char *zName;
	sxi32 rc;
	/* Extract line number */
	nLine = pGen->pIn->nLine;
	/* Jump the left parenthesis '(' */
	pGen->pIn++;
	/* Delimit the function signature */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pEnd >= pGen->pEnd ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Missing ')' after function '%z' signature", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		pGen->pIn = pGen->pEnd;
		return SXRET_OK;
	}
	/* Create the function state */
	pFunc = (jx9_vm_func *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(jx9_vm_func));
	if( pFunc == 0 ){
		goto OutOfMem;
	}
	/* function ID */
	zName = SyMemBackendStrDup(&pGen->pVm->sAllocator, pName->zString, pName->nByte);
	if( zName == 0 ){
		/* Don't worry about freeing memory, everything will be released shortly */
		goto OutOfMem;
	}
	/* Initialize the function state */
	jx9VmInitFuncState(pGen->pVm, pFunc, zName, pName->nByte, iFlags, 0);
	if( pGen->pIn < pEnd ){
		/* Collect function arguments */
		rc = GenStateCollectFuncArgs(pFunc, &(*pGen), pEnd);
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
	}
	/* Compile function body */
	pGen->pIn = &pEnd[1];
	/* Compile the body */
	rc = GenStateCompileFuncBody(&(*pGen), pFunc);
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	if( ppFunc ){
		*ppFunc = pFunc;
	}
	/* Finally register the function */
	rc = jx9VmInstallUserFunction(pGen->pVm, pFunc, 0);
	return rc;
	/* Fall through if something goes wrong */
OutOfMem:
	/* If the supplied memory subsystem is so sick that we are unable to allocate
	 * a tiny chunk of memory, there is no much we can do here.
	 */
	return GenStateOutOfMem(pGen);
}